

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_recv_data(udp_ep *ep,udp_sp_data *dreq,size_t len,nng_sockaddr *sa)

{
  nni_lmq *lmq;
  uint32_t uVar1;
  uint uVar2;
  nni_msg *m;
  undefined1 msg_00 [8];
  _Bool _Var3;
  udp_pipe *p;
  nni_time nVar4;
  size_t sVar5;
  void *__dest;
  void *__src;
  nni_aio *aio;
  int iVar6;
  undefined1 local_48 [8];
  nni_msg *msg;
  undefined2 local_38;
  
  uVar1 = dreq->us_sender_id;
  uVar2 = dreq->us_peer_id;
  p = (udp_pipe *)nni_id_get(&ep->pipes,(ulong)uVar2);
  if (((p == (udp_pipe *)0x0) || (p->closed != false)) || (p->peer_id != uVar1 && p->peer_id != 0))
  {
    p = (udp_pipe *)0x0;
  }
  if (p == (udp_pipe *)0x0) {
    nni_stat_inc(&ep->st_rcv_nomatch,1);
    local_48._2_2_ = ep->proto;
    local_48._0_2_ = 0x301;
    local_48._4_4_ = uVar1;
    msg._4_4_ = 0;
    local_38 = 2;
    msg._0_4_ = uVar2;
    udp_queue_tx(ep,sa,(udp_sp_msg *)local_48,(nni_msg *)0x0);
    return;
  }
  if (p->peer_id == 0) {
    nni_stat_inc(&ep->st_rcv_nomatch,1);
    udp_send_creq(ep,p);
    return;
  }
  nVar4 = nni_clock();
  if ((len < dreq->us_length) || (p->rcvmax < dreq->us_length)) {
    nni_stat_inc(&ep->st_rcv_toobig,1);
    udp_send_disc(ep,p,DISC_MSGSIZE);
    return;
  }
  p->expire = (long)p->refresh * 5 + nVar4;
  p->next_wake = nVar4 + (long)p->refresh;
  udp_pipe_schedule(p);
  m = ep->rx_payload;
  sVar5 = nni_msg_len(m);
  nni_msg_chop(m,sVar5 - dreq->us_length);
  uVar1 = dreq->us_sequence;
  iVar6 = uVar1 - p->peer_seq;
  if (iVar6 < 0) {
    nni_stat_inc(&p->ep->st_rcv_reorder,1);
  }
  else {
    if (uVar1 != p->peer_seq) {
      nni_stat_inc(&p->ep->st_rcv_reorder,1);
    }
    p->peer_seq = uVar1 + 1;
  }
  if (iVar6 < 0) {
    return;
  }
  lmq = &p->rx_mq;
  _Var3 = nni_lmq_full(lmq);
  if (_Var3) {
    nni_lmq_get(lmq,(nng_msg **)local_48);
    nni_msg_free((nni_msg *)local_48);
    nni_stat_inc(&ep->st_rcv_nobuf,1);
  }
  if (ep->copymax < len) {
    nni_stat_inc(&ep->st_rcv_nocopy,1);
    local_48 = (undefined1  [8])ep->rx_payload;
    iVar6 = nng_msg_alloc(&ep->rx_payload,(ulong)ep->rcvmax);
    if (iVar6 == 0) {
      sVar5 = nng_msg_len((nng_msg *)local_48);
      msg_00 = local_48;
      if (sVar5 < len) {
        sVar5 = nng_msg_len((nng_msg *)local_48);
        nng_msg_chop((nng_msg *)msg_00,sVar5 - len);
      }
      nni_msg_set_address((nng_msg *)local_48,sa);
      nni_lmq_put(lmq,(nng_msg *)local_48);
LAB_0012e426:
      aio = (nni_aio *)nni_list_first(&p->rx_aios);
      if (aio == (nni_aio *)0x0) {
        return;
      }
      do {
        _Var3 = nni_lmq_empty(lmq);
        if (_Var3) {
          return;
        }
        nni_aio_list_remove(aio);
        nni_lmq_get(lmq,(nng_msg **)local_48);
        nni_aio_set_msg(aio,(nni_msg *)local_48);
        sVar5 = nni_aio_count(aio);
        nni_aio_completions_add(&ep->complq,aio,NNG_OK,sVar5);
        aio = (nni_aio *)nni_list_first(&p->rx_aios);
      } while (aio != (nni_aio *)0x0);
      return;
    }
    ep->rx_payload = (nni_msg *)local_48;
  }
  else {
    nni_stat_inc(&ep->st_rcv_copy,1);
    iVar6 = nng_msg_alloc((nng_msg **)local_48,len);
    if (iVar6 == 0) {
      nni_msg_set_address((nng_msg *)local_48,sa);
      __dest = nni_msg_body((nni_msg *)local_48);
      __src = nni_msg_body(ep->rx_payload);
      memcpy(__dest,__src,len);
      nni_lmq_put(lmq,(nng_msg *)local_48);
      nni_msg_realloc(ep->rx_payload,(ulong)ep->rcvmax);
      goto LAB_0012e426;
    }
  }
  if (p->npipe != (nni_pipe *)0x0) {
    nni_pipe_bump_error(p->npipe,2);
  }
  return;
}

Assistant:

static void
udp_recv_data(udp_ep *ep, udp_sp_data *dreq, size_t len, nng_sockaddr *sa)
{
	// NB: ep mtx is locked
	udp_pipe *p;
	nni_aio  *aio;
	nni_msg  *msg;
	nni_time  now;

	// send_id is the remote peer's ID
	// peer_id is our ID (receiver ID)
	// sequence number is our sender's sequence
	uint32_t send_id = dreq->us_sender_id;
	uint32_t peer_id = dreq->us_peer_id;

	// NB: Peer ID endianness does not matter, as long we use it
	// consistently.
	if ((p = udp_find_pipe(ep, peer_id, send_id)) == NULL) {
		nni_stat_inc(&ep->st_rcv_nomatch, 1);
		udp_send_disc_full(ep, sa, send_id, peer_id, 0, DISC_NOTCONN);
		// Question: how do we store the sockaddr for that?
		return;
	}
	if (p->peer_id == 0) {
		// connection isn't formed yet ... send another CREQ
		nni_stat_inc(&ep->st_rcv_nomatch, 1);
		udp_send_creq(ep, p);
		return;
	}

	now = nni_clock();

	// Make sure the message wasn't truncated, and that it fits within
	// our maximum agreed upon payload.
	if ((dreq->us_length > len) || (dreq->us_length > p->rcvmax)) {
		nni_stat_inc(&ep->st_rcv_toobig, 1);
		udp_send_disc(ep, p, DISC_MSGSIZE);
		return;
	}

	p->expire    = now + UDP_PIPE_TIMEOUT(p);
	p->next_wake = now + UDP_PIPE_REFRESH(p);

	udp_pipe_schedule(p);

	// trim the message down to its
	nni_msg_chop(
	    ep->rx_payload, nni_msg_len(ep->rx_payload) - dreq->us_length);

	if (!udp_check_pipe_sequence(p, dreq->us_sequence)) {
		// out of order delivery, drop it
		return;
	}

	// We have a choice to make.  Drop this message (easiest), or
	// drop the oldest.  We drop the oldest because generally we
	// find that applications prefer to have more recent data rather
	// than keeping stale data.
	if (nni_lmq_full(&p->rx_mq)) {
		nni_msg *old;
		(void) nni_lmq_get(&p->rx_mq, &old);
		nni_msg_free(old);
		nni_stat_inc(&ep->st_rcv_nobuf, 1);
	}

	// Short message, just alloc and copy
	if (len <= ep->copymax) {
		nni_stat_inc(&ep->st_rcv_copy, 1);
		if (nng_msg_alloc(&msg, len) != 0) {
			if (p->npipe != NULL) {
				nni_pipe_bump_error(p->npipe, NNG_ENOMEM);
			}
			return;
		}
		nni_msg_set_address(msg, sa);
		memcpy(nni_msg_body(msg), nni_msg_body(ep->rx_payload), len);
		nni_lmq_put(&p->rx_mq, msg);
		nni_msg_realloc(ep->rx_payload, ep->rcvmax);
	} else {
		nni_stat_inc(&ep->st_rcv_nocopy, 1);
		// Message size larger than copy break, do zero copy
		msg = ep->rx_payload;
		if (nng_msg_alloc(&ep->rx_payload, ep->rcvmax) != 0) {
			ep->rx_payload = msg; // make sure we put it back
			if (p->npipe != NULL) {
				nni_pipe_bump_error(p->npipe, NNG_ENOMEM);
			}
			return;
		}

		if (len > nng_msg_len(msg)) {
			// chop off any unfilled tail
			nng_msg_chop(msg, nng_msg_len(msg) - len);
		}
		nni_msg_set_address(msg, sa);
		nni_lmq_put(&p->rx_mq, msg);
	}

	while (((aio = nni_list_first(&p->rx_aios)) != NULL) &&
	    (!nni_lmq_empty(&p->rx_mq))) {
		nni_aio_list_remove(aio);
		nni_lmq_get(&p->rx_mq, &msg);
		nni_aio_set_msg(aio, msg);
		nni_aio_completions_add(
		    &ep->complq, aio, 0, nni_aio_count(aio));
	}
}